

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O3

void api_suite::api_size(void)

{
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  undefined4 local_4c;
  value_type local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  constant_map<int,_int,_4UL,_std::less<int>_> local_28;
  
  local_38 = 0x300000021;
  uStack_30 = 0x10000000b;
  local_48.first = 0x16;
  local_48.second = 2;
  uStack_40 = 0x40000002c;
  vista::constant_map<int,_int,_4UL,_std::less<int>_>::constant_map
            (&local_28,(value_type (*) [4])&local_48);
  local_48.first = 4;
  local_48.second = 0;
  local_4c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("map.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x58,"void api_suite::api_size()",&local_48,&local_4c);
  return;
}

Assistant:

void api_size()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST_EQ(map.size(), 4);
}